

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O2

void __thiscall mathOps_trigTan_Test::TestBody(mathOps_trigTan_Test *this)

{
  double dVar1;
  char *pcVar2;
  AssertHelper local_90;
  AssertionResult gtest_ar_3;
  precise_measurement m4;
  AssertHelper local_60;
  precise_measurement m3;
  measurement m2;
  measurement m1;
  
  m1.value_ = 0.5235987755982988;
  m1.units_.multiplier_ = 1.0;
  m1.units_.base_units_ = (unit_data)0x200000;
  dVar1 = units::tan<units::measurement,void>(&m1);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&m3,"tan(m1)","tan(constants::pi / 6.0)",(float)dVar1,0.57735026);
  if (m3.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&m4);
    if (m3.units_.multiplier_ == 0.0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)m3.units_.multiplier_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2,(Message *)&m4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2);
    if (m4.value_ != 0.0) {
      (**(code **)(*(long *)m4.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m3.units_);
  m2.value_ = 30.0;
  m2.units_.multiplier_ = 0.017453292;
  m2.units_.base_units_ = (unit_data)0x200000;
  dVar1 = units::tan<units::measurement,void>(&m2);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&m3,"tan(m2)","tan(constants::pi / 6.0)",(float)dVar1,0.57735026);
  if (m3.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&m4);
    if (m3.units_.multiplier_ == 0.0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)m3.units_.multiplier_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3,(Message *)&m4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3);
    if (m4.value_ != 0.0) {
      (**(code **)(*(long *)m4.value_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m3.units_);
  m3.value_ = 0.5235987755982988;
  m3.units_.multiplier_ = (double)0x3ff0000000000000;
  m3.units_.base_units_ = (unit_data)0x200000;
  m3.units_.commodity_ = 0;
  dVar1 = units::tan<units::precise_measurement,void>(&m3);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&m4,"tan(m3)","tan(constants::pi / 6.0)",dVar1,0.5773502691896257);
  if (m4.value_._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (m4.units_.multiplier_ == 0.0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)m4.units_.multiplier_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xa0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_3);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((long *)CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_3._1_7_,gtest_ar_3.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&m4.units_);
  m4.value_ = 30.0;
  m4.units_.multiplier_ = (double)0x3f91df46a2529d39;
  m4.units_.base_units_ = (unit_data)0x200000;
  m4.units_.commodity_ = 0;
  dVar1 = units::tan<units::precise_measurement,void>(&m4);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_3,"tan(m4)","tan(constants::pi / 6.0)",dVar1,0.5773502691896257);
  if (gtest_ar_3.success_ == false) {
    testing::Message::Message((Message *)&local_90);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xa3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_90.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_90.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_3.message_);
  return;
}

Assistant:

TEST(mathOps, trigTan)
{
    measurement m1(constants::pi / 6.0, rad);
    EXPECT_FLOAT_EQ(tan(m1), tan(constants::pi / 6.0));

    measurement m2(30.0, deg);
    EXPECT_FLOAT_EQ(tan(m2), tan(constants::pi / 6.0));

    precise_measurement m3(constants::pi / 6.0, precise::rad);
    EXPECT_DOUBLE_EQ(tan(m3), tan(constants::pi / 6.0));

    precise_measurement m4(30.0, precise::deg);
    EXPECT_DOUBLE_EQ(tan(m4), tan(constants::pi / 6.0));
}